

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O2

aom_codec_err_t
aom_read_obu_header_and_size
          (uint8_t *data,size_t bytes_available,int is_annexb,ObuHeader *obu_header,
          size_t *payload_size,size_t *bytes_read)

{
  aom_codec_err_t aVar1;
  long lVar2;
  size_t length_field_size_obu;
  size_t obu_size;
  size_t length_field_size_payload;
  aom_read_bit_buffer local_58;
  
  length_field_size_obu = 0;
  length_field_size_payload = 0;
  obu_size = 0;
  if ((is_annexb == 0) ||
     (aVar1 = read_obu_size(data,bytes_available,&obu_size,&length_field_size_obu),
     aVar1 == AOM_CODEC_OK)) {
    local_58.bit_buffer = data + length_field_size_obu;
    local_58.bit_buffer_end = data + bytes_available;
    local_58.bit_offset = 0;
    local_58.error_handler_data = (void *)0x0;
    local_58.error_handler = (aom_rb_error_handler)0x0;
    aVar1 = read_obu_header(&local_58,is_annexb,obu_header);
    if (aVar1 == AOM_CODEC_OK) {
      if (obu_header->has_size_field == 0) {
        if (obu_size < obu_header->size) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        *payload_size = obu_size - obu_header->size;
        length_field_size_payload = 0;
      }
      else {
        lVar2 = length_field_size_obu + obu_header->size;
        aVar1 = read_obu_size(data + lVar2,bytes_available - lVar2,payload_size,
                              &length_field_size_payload);
        if (aVar1 != AOM_CODEC_OK) {
          return aVar1;
        }
      }
      *bytes_read = obu_header->size + length_field_size_obu + length_field_size_payload;
      aVar1 = AOM_CODEC_OK;
    }
  }
  return aVar1;
}

Assistant:

aom_codec_err_t aom_read_obu_header_and_size(const uint8_t *data,
                                             size_t bytes_available,
                                             int is_annexb,
                                             ObuHeader *obu_header,
                                             size_t *const payload_size,
                                             size_t *const bytes_read) {
  size_t length_field_size_obu = 0;
  size_t length_field_size_payload = 0;
  size_t obu_size = 0;
  aom_codec_err_t status;

  if (is_annexb) {
    // Size field comes before the OBU header, and includes the OBU header
    status =
        read_obu_size(data, bytes_available, &obu_size, &length_field_size_obu);

    if (status != AOM_CODEC_OK) return status;
  }

  struct aom_read_bit_buffer rb = { data + length_field_size_obu,
                                    data + bytes_available, 0, NULL, NULL };

  status = read_obu_header(&rb, is_annexb, obu_header);
  if (status != AOM_CODEC_OK) return status;

  if (!obu_header->has_size_field) {
    assert(is_annexb);
    // Derive the payload size from the data we've already read
    if (obu_size < obu_header->size) return AOM_CODEC_CORRUPT_FRAME;

    *payload_size = obu_size - obu_header->size;
  } else {
    // Size field comes after the OBU header, and is just the payload size
    status = read_obu_size(
        data + length_field_size_obu + obu_header->size,
        bytes_available - length_field_size_obu - obu_header->size,
        payload_size, &length_field_size_payload);
    if (status != AOM_CODEC_OK) return status;
  }

  *bytes_read =
      length_field_size_obu + obu_header->size + length_field_size_payload;
  return AOM_CODEC_OK;
}